

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O2

bool rsg::anon_unknown_13::
     compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
               (ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  bool bVar1;
  bool bVar2;
  Type TVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  VariableType *pVVar7;
  ConstValueRangeAccess *pCVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  ConstValueRangeAccess local_70;
  ConstValueRangeAccess *local_58;
  float local_4c;
  ConstValueRangeAccess local_48;
  
  pVVar7 = a->m_type;
  TVar3 = pVVar7->m_baseType;
  if (TVar3 == TYPE_ARRAY) {
    iVar11 = 0;
    iVar10 = pVVar7->m_numElements;
    if (pVVar7->m_numElements < 1) {
      iVar10 = 0;
    }
    do {
      bVar12 = iVar10 == iVar11;
      if (bVar12) {
        return bVar12;
      }
      ConstValueRangeAccess::arrayElement(&local_70,a,iVar11);
      ConstValueRangeAccess::arrayElement(&local_48,b,iVar11);
      bVar9 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                        (&local_70,&local_48);
      iVar11 = iVar11 + 1;
    } while (bVar9);
  }
  else if (TVar3 == TYPE_STRUCT) {
    iVar10 = 0;
    iVar11 = (int)(((long)(pVVar7->m_members).
                          super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pVVar7->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    do {
      bVar12 = iVar11 == iVar10;
      if (bVar12) {
        return bVar12;
      }
      ConstValueRangeAccess::member(&local_70,a,iVar10);
      ConstValueRangeAccess::member(&local_48,b,iVar10);
      bVar9 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                        (&local_70,&local_48);
      iVar10 = iVar10 + 1;
    } while (bVar9);
  }
  else {
    bVar12 = false;
    if (TVar3 - TYPE_FLOAT < 7) {
      iVar10 = pVVar7->m_numElements;
      local_58 = b;
      switch(TVar3) {
      case TYPE_FLOAT:
        iVar11 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        while (bVar12 = iVar10 == iVar11, !bVar12) {
          ConstValueRangeAccess::component(&local_70,a,iVar11);
          local_4c = (local_70.m_min)->floatVal;
          ConstValueRangeAccess::component(&local_70,a,iVar11);
          fVar4 = (local_70.m_max)->floatVal;
          ConstValueRangeAccess::component(&local_70,b,iVar11);
          local_58 = (ConstValueRangeAccess *)CONCAT44(local_58._4_4_,(local_70.m_min)->intVal);
          ConstValueRangeAccess::component(&local_70,b,iVar11);
          if (fVar4 < local_58._0_4_) {
            return bVar12;
          }
          iVar11 = iVar11 + 1;
          if ((local_70.m_max)->floatVal < local_4c) {
            return bVar12;
          }
        }
        break;
      default:
        iVar11 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        while (pCVar8 = local_58, bVar12 = iVar10 == iVar11, !bVar12) {
          ConstValueRangeAccess::component(&local_70,a,iVar11);
          fVar4 = (float)(local_70.m_min)->intVal;
          ConstValueRangeAccess::component(&local_70,a,iVar11);
          fVar5 = (float)(local_70.m_max)->intVal;
          ConstValueRangeAccess::component(&local_70,pCVar8,iVar11);
          fVar6 = (float)(local_70.m_min)->intVal;
          ConstValueRangeAccess::component(&local_70,pCVar8,iVar11);
          if ((int)fVar5 < (int)fVar6) {
            return bVar12;
          }
          iVar11 = iVar11 + 1;
          if ((local_70.m_max)->intVal < (int)fVar4) {
            return bVar12;
          }
        }
        break;
      case TYPE_BOOL:
        iVar11 = 0;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        while (pCVar8 = local_58, bVar12 = iVar10 == iVar11, !bVar12) {
          ConstValueRangeAccess::component(&local_70,a,iVar11);
          bVar9 = (local_70.m_min)->boolVal;
          ConstValueRangeAccess::component(&local_70,a,iVar11);
          bVar1 = (local_70.m_max)->boolVal;
          ConstValueRangeAccess::component(&local_70,pCVar8,iVar11);
          bVar2 = (local_70.m_min)->boolVal;
          ConstValueRangeAccess::component(&local_70,pCVar8,iVar11);
          if ((byte)(bVar2 ^ 1U | bVar1) != 1) {
            return bVar12;
          }
          iVar11 = iVar11 + 1;
          if (bVar9 == true && (local_70.m_max)->boolVal == false) {
            return bVar12;
          }
        }
        break;
      case TYPE_STRUCT:
      case TYPE_ARRAY:
        break;
      }
    }
  }
  return bVar12;
}

Assistant:

bool compareValueRangesAllTrue (const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(a.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.member(ndx), b.member(ndx)))
				return false;
		}
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.arrayElement(ndx), b.arrayElement(ndx)))
				return false;
		}
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
				return false;
		}
	}

	return true;
}